

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O1

String * __thiscall CommandInfo::signature(String *__return_storage_ptr__,CommandInfo *this)

{
  iterator *this_00;
  DataType DVar1;
  pointer pcVar2;
  _Map_pointer ppCVar3;
  int iVar4;
  reference pCVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  int local_e0;
  int local_dc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  String local_b0;
  String local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  String local_50;
  
  local_d8 = &(__return_storage_ptr__->_string).field_2;
  (__return_storage_ptr__->_string)._M_dataplus._M_p = (pointer)local_d8;
  (__return_storage_ptr__->_string)._M_string_length = 0;
  (__return_storage_ptr__->_string).field_2._M_local_buf[0] = '\0';
  dataTypeName(&local_50,this->returnvalue);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
    operator_delete(local_50._string._M_dataplus._M_p);
  }
  cVar6 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar6);
  pcVar2 = (this->name)._string._M_dataplus._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar2,pcVar2 + (this->name)._string._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  ppCVar3 = (this->args)._deque.super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if ((int)((ulong)((long)(this->args)._deque.
                          super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_last -
                   (long)(this->args)._deque.
                         super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) * -0x55555555 +
      (int)((ulong)((long)(this->args)._deque.
                          super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                          _M_impl.super__Deque_impl_data._M_finish._M_cur -
                   (long)(this->args)._deque.
                         super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                         _M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) * -0x55555555 +
      ((int)((ulong)((long)ppCVar3 -
                    (long)(this->args)._deque.
                          super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                          _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
      (uint)(ppCVar3 == (_Map_pointer)0x0)) * 10 != 0) {
    std::__cxx11::string::push_back(cVar6);
  }
  std::__cxx11::string::push_back(cVar6);
  this_00 = &(this->args)._deque.
             super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>._M_impl.
             super__Deque_impl_data._M_start;
  bVar7 = false;
  for (iVar8 = 0;
      ppCVar3 = (this->args)._deque.
                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,
      iVar8 < (int)((int)((ulong)((long)(this->args)._deque.
                                        super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_last -
                                 (long)(this->args)._deque.
                                       super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) *
                    -0x55555555 +
                   (int)((ulong)((long)(this->args)._deque.
                                       super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                       ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                                (long)(this->args)._deque.
                                      super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                      ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) *
                   -0x55555555 +
                   ((int)((ulong)((long)ppCVar3 -
                                 (long)(this->args)._deque.
                                       super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1
                   + (uint)(ppCVar3 == (_Map_pointer)0x0)) * 10); iVar8 = iVar8 + 1) {
    if (iVar8 == this->minargs) {
      bVar7 = true;
      std::__cxx11::string::push_back(cVar6);
    }
    if (iVar8 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ppCVar3 = (this->args)._deque.
              super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    iVar4 = (int)((ulong)((long)(this->args)._deque.
                                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->args)._deque.
                               super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) * -0x55555555 +
            (int)((ulong)((long)(this->args)._deque.
                                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->args)._deque.
                               super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) *
            -0x55555555 +
            ((int)((ulong)((long)ppCVar3 -
                          (long)(this->args)._deque.
                                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar3 == (_Map_pointer)0x0)) * 10;
    local_e0 = iVar8;
    if (iVar4 <= iVar8) {
      local_dc = iVar4;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,&local_e0,&local_dc);
    }
    pCVar5 = std::_Deque_iterator<CommandArgument,_CommandArgument_&,_CommandArgument_*>::operator[]
                       (this_00,(long)local_e0);
    dataTypeName(&local_90,pCVar5->type);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._string._M_dataplus._M_p != &local_90._string.field_2) {
      operator_delete(local_90._string._M_dataplus._M_p);
    }
    std::__cxx11::string::push_back(cVar6);
    ppCVar3 = (this->args)._deque.
              super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    iVar4 = (int)((ulong)((long)(this->args)._deque.
                                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_last -
                         (long)(this->args)._deque.
                               super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) * -0x55555555 +
            (int)((ulong)((long)(this->args)._deque.
                                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                         (long)(this->args)._deque.
                               super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) *
            -0x55555555 +
            ((int)((ulong)((long)ppCVar3 -
                          (long)(this->args)._deque.
                                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar3 == (_Map_pointer)0x0)) * 10;
    local_e0 = iVar8;
    if (iVar4 <= iVar8) {
      local_dc = iVar4;
      error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                     ,&local_e0,&local_dc);
    }
    pCVar5 = std::_Deque_iterator<CommandArgument,_CommandArgument_&,_CommandArgument_*>::operator[]
                       (this_00,(long)local_e0);
    local_d0[0] = local_c0;
    pcVar2 = (pCVar5->name)._string._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d0,pcVar2,pcVar2 + (pCVar5->name)._string._M_string_length);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (local_d0[0] != local_c0) {
      operator_delete(local_d0[0]);
    }
    if (this->minargs <= iVar8) {
      ppCVar3 = (this->args)._deque.
                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      iVar4 = (int)((ulong)((long)(this->args)._deque.
                                  super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)(this->args)._deque.
                                 super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) *
              -0x55555555 +
              (int)((ulong)((long)(this->args)._deque.
                                  super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)(this->args)._deque.
                                 super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) *
              -0x55555555 +
              ((int)((ulong)((long)ppCVar3 -
                            (long)(this->args)._deque.
                                  super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppCVar3 == (_Map_pointer)0x0)) * 10;
      local_e0 = iVar8;
      if (iVar4 <= iVar8) {
        local_dc = iVar4;
        error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                       ,&local_e0,&local_dc);
      }
      pCVar5 = std::_Deque_iterator<CommandArgument,_CommandArgument_&,_CommandArgument_*>::
               operator[](this_00,(long)local_e0);
      DVar1 = pCVar5->type;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (DVar1 == TYPE_String) {
        std::__cxx11::string::push_back(cVar6);
      }
      ppCVar3 = (this->args)._deque.
                super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      iVar4 = (int)((ulong)((long)(this->args)._deque.
                                  super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_last -
                           (long)(this->args)._deque.
                                 super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                 ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) *
              -0x55555555 +
              (int)((ulong)((long)(this->args)._deque.
                                  super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                           (long)(this->args)._deque.
                                 super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                 ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) *
              -0x55555555 +
              ((int)((ulong)((long)ppCVar3 -
                            (long)(this->args)._deque.
                                  super__Deque_base<CommandArgument,_std::allocator<CommandArgument>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
              (uint)(ppCVar3 == (_Map_pointer)0x0)) * 10;
      local_e0 = iVar8;
      if (iVar4 <= iVar8) {
        local_dc = iVar4;
        error<int,int>("assertion failed at /workspace/llm4binary/github/license_all_cmakelists_25/TarCV[P]botc/src/list.h:257: n (%1) is not less than size() (%2)"
                       ,&local_e0,&local_dc);
      }
      pCVar5 = std::_Deque_iterator<CommandArgument,_CommandArgument_&,_CommandArgument_*>::
               operator[](this_00,(long)local_e0);
      String::fromNumber(&local_b0,pCVar5->defvalue);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._string._M_dataplus._M_p != &local_b0._string.field_2) {
        operator_delete(local_b0._string._M_dataplus._M_p);
      }
      if (DVar1 == TYPE_String) {
        std::__cxx11::string::push_back(cVar6);
      }
    }
  }
  if (bVar7) {
    std::__cxx11::string::push_back(cVar6);
  }
  std::__cxx11::string::push_back(cVar6);
  return __return_storage_ptr__;
}

Assistant:

String CommandInfo::signature()
{
	String text;
	text += dataTypeName (returnvalue);
	text += ' ';
	text += name;

	if (args.isEmpty() == false)
		text += ' ';

	text += '(';

	bool hasoptionals = false;

	for (int i = 0; i < args.size(); i++)
	{
		if (i == minargs)
		{
			hasoptionals = true;
			text += '[';
		}

		if (i)
			text += ", ";

		text += dataTypeName (args[i].type);
		text += ' ';
		text += args[i].name;

		if (i >= minargs)
		{
			bool isString = args[i].type == TYPE_String;
			text += " = ";

			if (isString)
				text += '"';

			text += String::fromNumber (args[i].defvalue);

			if (isString)
				text += '"';
		}
	}

	if (hasoptionals)
		text += ']';

	text += ')';
	return text;
}